

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O0

int Version(void)

{
  ostream *poVar1;
  stringstream versionStream;
  string local_1b8 [48];
  stringstream local_188 [16];
  undefined1 local_178 [376];
  
  std::__cxx11::stringstream::stringstream(local_188);
  poVar1 = (ostream *)std::ostream::operator<<(local_178,2);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,2);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"bamtools ");
  std::__cxx11::stringstream::str();
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Part of BamTools API and toolkit");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Primary authors: Derek Barnett, Erik Garrison, Michael Stromberg");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "(c) 2009-2012 Marth Lab, Biology Dept., Boston College");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_188);
  return 0;
}

Assistant:

int Version()
{

    std::stringstream versionStream;
    versionStream << BAMTOOLS_VERSION_MAJOR << '.' << BAMTOOLS_VERSION_MINOR << '.'
                  << BAMTOOLS_VERSION_PATCH;

    std::cout << std::endl;
    std::cout << "bamtools " << versionStream.str() << std::endl;
    std::cout << "Part of BamTools API and toolkit" << std::endl;
    std::cout << "Primary authors: Derek Barnett, Erik Garrison, Michael Stromberg" << std::endl;
    std::cout << "(c) 2009-2012 Marth Lab, Biology Dept., Boston College" << std::endl;
    std::cout << std::endl;
    return EXIT_SUCCESS;
}